

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

tuple<SudokuGitter,_SudokuGitter> *
mainBigSudoku(tuple<SudokuGitter,_SudokuGitter> *__return_storage_ptr__,int elements)

{
  _List_node_base *p_Var1;
  SudokuGenerator generator;
  SudokuGitter local_138;
  SudokuGitter local_108;
  _Tuple_impl<0UL,_SudokuGitter,_SudokuGitter> local_d8;
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  local_88;
  SudokuGenerator local_68;
  
  SudokuGenerator::SudokuGenerator(&local_68,elements);
  SudokuGenerator::generateNewBig(__return_storage_ptr__,&local_68);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&local_108.cells,
           (vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
            *)&(__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
               super__Head_base<0UL,_SudokuGitter,_false>);
  local_108.quadHeight =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.quadHeight;
  local_108.elements =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.elements;
  local_108.quadWidth =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Head_base<0UL,_SudokuGitter,_false>._M_head_impl.quadWidth;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&local_138.cells,
           (vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
            *)__return_storage_ptr__);
  local_138.quadHeight =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
       quadHeight;
  local_138.elements =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
       elements;
  local_138.quadWidth =
       (__return_storage_ptr__->super__Tuple_impl<0UL,_SudokuGitter,_SudokuGitter>).
       super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>._M_head_impl.
       quadWidth;
  SudokuGitter::getSolvable((SudokuGitter *)&local_d8,&local_108);
  local_88.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_108.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_108.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_108.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_108.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_108.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
  _M_head_impl.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
  _M_head_impl.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
  _M_head_impl.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_88);
  local_108.quadHeight =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.quadHeight;
  local_108.elements =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.elements;
  local_108.quadWidth =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.quadWidth;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_d8);
  SudokuGitter::getSolvable((SudokuGitter *)&local_d8,&local_138);
  local_88.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_138.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_138.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_138.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_138.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_138.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_138.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.cells.
       super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
  _M_head_impl.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
  _M_head_impl.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
  _M_head_impl.cells.
  super__Vector_base<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_88);
  local_138.quadHeight =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.quadHeight;
  local_138.elements =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.elements;
  local_138.quadWidth =
       local_d8.super__Tuple_impl<1UL,_SudokuGitter>.super__Head_base<1UL,_SudokuGitter,_false>.
       _M_head_impl.quadWidth;
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_d8);
  std::_Tuple_impl<0ul,SudokuGitter,SudokuGitter>::_Tuple_impl<SudokuGitter&,SudokuGitter&,void>
            ((_Tuple_impl<0ul,SudokuGitter,SudokuGitter> *)&local_d8,&local_108,&local_138);
  std::_Tuple_impl<0ul,SudokuGitter,SudokuGitter>::_M_assign<SudokuGitter,SudokuGitter>
            ((_Tuple_impl<0ul,SudokuGitter,SudokuGitter> *)__return_storage_ptr__,&local_d8);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_d8.super__Head_base<0UL,_SudokuGitter,_false>);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector((vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
             *)&local_d8);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_138.cells);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_108.cells);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::~vector(&local_68.gitter.cells);
  while (local_68.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
         super__List_node_base._M_next != (_List_node_base *)&local_68.errorInRow) {
    p_Var1 = (local_68.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
              super__List_node_base._M_next)->_M_next;
    operator_delete(local_68.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                    super__List_node_base._M_next);
    local_68.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var1;
  }
  return __return_storage_ptr__;
}

Assistant:

tuple<SudokuGitter, SudokuGitter> mainBigSudoku(int elements){
    SudokuGenerator generator = SudokuGenerator(elements);
    tuple<SudokuGitter, SudokuGitter> bigGitter = generator.generateNewBig();
    SudokuGitter gitter1 = std::get<0>(bigGitter);
    SudokuGitter gitter2 = std::get<1>(bigGitter);
    gitter1 = gitter1.getSolvable();
    gitter2 = gitter2.getSolvable();
    bigGitter = std::make_tuple(gitter1, gitter2);
    return bigGitter;
}